

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O2

void __thiscall duckdb::ColumnData::BeginScanVectorInternal(ColumnData *this,ColumnScanState *state)

{
  ulong uVar1;
  
  ::std::
  vector<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>_>_>
  ::clear(&(state->previous_states).
           super_vector<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>_>_>
         );
  if (state->initialized == true) {
    uVar1 = state->internal_index;
  }
  else {
    ColumnSegment::InitializeScan(state->current,state);
    uVar1 = (state->current->super_SegmentBase<duckdb::ColumnSegment>).start;
    state->internal_index = uVar1;
    state->initialized = true;
  }
  if (uVar1 < state->row_index) {
    ColumnSegment::Skip(state->current,state);
    return;
  }
  return;
}

Assistant:

void ColumnData::BeginScanVectorInternal(ColumnScanState &state) {
	state.previous_states.clear();
	if (!state.initialized) {
		D_ASSERT(state.current);
		state.current->InitializeScan(state);
		state.internal_index = state.current->start;
		state.initialized = true;
	}
	D_ASSERT(data.HasSegment(state.current));
	D_ASSERT(state.internal_index <= state.row_index);
	if (state.internal_index < state.row_index) {
		state.current->Skip(state);
	}
	D_ASSERT(state.current->type == type);
}